

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

int QString::localeAwareCompare_helper
              (QChar *data1,qsizetype length1,QChar *data2,qsizetype length2)

{
  int iVar1;
  int iVar2;
  qsizetype qVar3;
  long lVar4;
  QStringView s2;
  QStringView s1;
  
  if (length1 != 0 && length2 != 0) {
    s2.m_data = &data2->ucs;
    s2.m_size = length2;
    s1.m_data = &data1->ucs;
    s1.m_size = length1;
    iVar2 = QCollator::defaultCompare(s1,s2);
    return iVar2;
  }
  qVar3 = length2;
  if ((ulong)length1 < (ulong)length2) {
    qVar3 = length1;
  }
  iVar2 = 0;
  if (qVar3 != 0) {
    lVar4 = 0;
    do {
      iVar2 = (uint)(ushort)data1[lVar4].ucs - (uint)(ushort)data2[lVar4].ucs;
      if (data1[lVar4].ucs != data2[lVar4].ucs) goto LAB_00332b9c;
      lVar4 = lVar4 + 1;
    } while (qVar3 != lVar4);
    iVar2 = 0;
  }
LAB_00332b9c:
  iVar1 = ((length2 < length1) - 1) + (uint)(length2 < length1);
  if (length1 == length2) {
    iVar1 = 0;
  }
  if (iVar2 != 0) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

int QString::localeAwareCompare_helper(const QChar *data1, qsizetype length1,
                                       const QChar *data2, qsizetype length2)
{
    Q_ASSERT(length1 >= 0);
    Q_ASSERT(data1 || length1 == 0);
    Q_ASSERT(length2 >= 0);
    Q_ASSERT(data2 || length2 == 0);

    // do the right thing for null and empty
    if (length1 == 0 || length2 == 0)
        return QtPrivate::compareStrings(QStringView(data1, length1), QStringView(data2, length2),
                               Qt::CaseSensitive);

#if QT_CONFIG(icu)
    return QCollator::defaultCompare(QStringView(data1, length1), QStringView(data2, length2));
#else
    const QString lhs = QString::fromRawData(data1, length1).normalized(QString::NormalizationForm_C);
    const QString rhs = QString::fromRawData(data2, length2).normalized(QString::NormalizationForm_C);
#  if defined(Q_OS_WIN)
    int res = CompareStringEx(LOCALE_NAME_USER_DEFAULT, 0, (LPWSTR)lhs.constData(), lhs.length(), (LPWSTR)rhs.constData(), rhs.length(), NULL, NULL, 0);

    switch (res) {
    case CSTR_LESS_THAN:
        return -1;
    case CSTR_GREATER_THAN:
        return 1;
    default:
        return 0;
    }
#  elif defined (Q_OS_DARWIN)
    // Use CFStringCompare for comparing strings on Mac. This makes Qt order
    // strings the same way as native applications do, and also respects
    // the "Order for sorted lists" setting in the International preferences
    // panel.
    const CFStringRef thisString =
        CFStringCreateWithCharactersNoCopy(kCFAllocatorDefault,
            reinterpret_cast<const UniChar *>(lhs.constData()), lhs.length(), kCFAllocatorNull);
    const CFStringRef otherString =
        CFStringCreateWithCharactersNoCopy(kCFAllocatorDefault,
            reinterpret_cast<const UniChar *>(rhs.constData()), rhs.length(), kCFAllocatorNull);

    const int result = CFStringCompare(thisString, otherString, kCFCompareLocalized);
    CFRelease(thisString);
    CFRelease(otherString);
    return result;
#  elif defined(Q_OS_UNIX)
    // declared in <string.h> (no better than QtPrivate::compareStrings() on Android, sadly)
    return strcoll(lhs.toLocal8Bit().constData(), rhs.toLocal8Bit().constData());
#  else
#     error "This case shouldn't happen"
    return QtPrivate::compareStrings(lhs, rhs, Qt::CaseSensitive);
#  endif
#endif // !QT_CONFIG(icu)
}